

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompiler.cpp
# Opt level: O0

void __thiscall
Diligent::anon_unknown_0::DXCompilerImpl::Compile
          (DXCompilerImpl *this,ShaderCreateInfo *ShaderCI,ShaderVersion ShaderModel,char *Preamble,
          IDxcBlob **ppByteCodeBlob,vector<unsigned_int,_std::allocator<unsigned_int>_> *pByteCode,
          IDataBlob **ppCompilerOutput)

{
  char *__s;
  initializer_list<const_wchar_t_*> __l;
  undefined *puVar1;
  DXCompilerImpl *pDVar2;
  bool bVar3;
  DXCompilerTarget DVar4;
  SHADER_COMPILE_FLAGS SVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Char *pCVar9;
  undefined8 uVar10;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __beg;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end;
  size_t sVar11;
  size_type sVar12;
  IDxcBlob *pIVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ShaderVersion ShaderModel_00;
  ShaderCreateInfo *ShaderCI_00;
  char (*in_stack_fffffffffffffbf8) [8];
  char (*in_stack_fffffffffffffc18) [21];
  char *local_378;
  CComPtrBase<IDxcBlob> local_370;
  bool local_351;
  wchar_t *pwStack_2e8;
  bool result;
  DxcDefine Defines [1];
  allocator<char> local_2b1;
  undefined1 local_2b0 [8];
  String Source;
  CompileAttribs CA;
  CComPtr<IDxcBlob> pDxcLog;
  CComPtr<IDxcBlob> pDXIL;
  undefined1 local_220 [8];
  string msg_1;
  wchar_t *local_1f8;
  Version local_1f0;
  wchar_t *local_1e8;
  wchar_t *pwStack_1e0;
  wchar_t *local_1d8;
  iterator local_1c8;
  undefined8 local_1c0;
  wchar_t *local_1b8;
  Version local_1b0;
  Version local_1a8;
  wchar_t *local_1a0;
  wchar_t *local_198;
  undefined1 local_190 [8];
  vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> DxilArgs;
  wstring local_170 [8];
  wstring wstrEntryPoint;
  wstring local_138 [8];
  wstring wstrProfile;
  undefined1 local_110 [8];
  String Profile;
  char local_e8;
  char cStack_e7;
  char cStack_e6;
  char cStack_e5;
  Uint32 local_e4;
  char local_dd;
  Uint32 local_dc;
  undefined1 local_d8 [8];
  string _msg_1;
  undefined4 local_ac;
  undefined1 local_a5;
  uint local_a4;
  undefined1 local_a0 [8];
  string _msg;
  ShaderVersion local_74;
  ShaderVersion MaxSM;
  undefined1 local_60 [8];
  string msg;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pByteCode_local;
  IDxcBlob **ppByteCodeBlob_local;
  char *Preamble_local;
  ShaderCreateInfo *ShaderCI_local;
  DXCompilerImpl *this_local;
  ShaderVersion ShaderModel_local;
  
  ShaderModel_00 = (ShaderVersion)Preamble;
  msg.field_2._8_8_ = pByteCode;
  this_local = (DXCompilerImpl *)ShaderModel;
  bVar3 = IsLoaded(this);
  if (bVar3) {
    local_74 = GetMaxShaderModel(this);
    Version::Version((Version *)((long)&_msg.field_2 + 0xc));
    bVar3 = Version::operator==((Version *)&this_local,(Version *)((long)&_msg.field_2 + 0xc));
    if (bVar3) {
      this_local = (DXCompilerImpl *)local_74;
    }
    else if ((uint)this_local < 6) {
      local_a4 = (uint)this_local;
      local_a5 = 0x5f;
      local_ac = this_local._4_4_;
      ShaderModel_00 = (ShaderVersion)&local_a5;
      FormatString<char[75],unsigned_int,char,unsigned_int,char[8]>
                ((string *)local_a0,
                 (Diligent *)
                 "DXC only supports shader model 6.0+. Upgrading the specified shader model ",
                 (char (*) [75])&local_a4,(uint *)ShaderModel_00,(char *)&local_ac,(uint *)" to 6_0"
                 ,in_stack_fffffffffffffbf8);
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar10 = std::__cxx11::string::c_str();
        ShaderModel_00.Major = 0;
        ShaderModel_00.Minor = 0;
        (*(code *)puVar1)(0,uVar10,0);
      }
      std::__cxx11::string::~string((string *)local_a0);
      Version::Version((Version *)((long)&_msg_1.field_2 + 0xc),6,0);
      this_local = stack0xffffffffffffff4c;
    }
    else {
      bVar3 = Version::operator>((Version *)&this_local,&local_74);
      pDVar2 = this_local;
      if (bVar3) {
        local_dc = local_74.Major;
        local_dd = '_';
        local_e4 = local_74.Minor;
        local_e8 = (char)this_local;
        cStack_e7 = this_local._1_1_;
        cStack_e6 = this_local._2_1_;
        cStack_e5 = this_local._3_1_;
        Profile.field_2._M_local_buf[0xf] = '_';
        this_local._4_4_ = SUB84(pDVar2,4);
        Profile.field_2._8_4_ = this_local._4_4_;
        ShaderModel_00 = (ShaderVersion)&local_dd;
        this_local = pDVar2;
        FormatString<char[46],unsigned_int,char,unsigned_int,char[30],unsigned_int,char,unsigned_int,char[21]>
                  ((string *)local_d8,(Diligent *)"The maximum supported shader model by DXC is ",
                   (char (*) [46])&local_dc,(uint *)ShaderModel_00,(char *)&local_e4,
                   (uint *)". The specified shader model ",(char (*) [30])&stack0xffffffffffffff18,
                   (uint *)(Profile.field_2._M_local_buf + 0xf),Profile.field_2._M_local_buf + 8,
                   (uint *)" will be downgraded.",in_stack_fffffffffffffc18);
        puVar1 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar10 = std::__cxx11::string::c_str();
          ShaderModel_00.Major = 0;
          ShaderModel_00.Minor = 0;
          (*(code *)puVar1)(1,uVar10,0);
        }
        std::__cxx11::string::~string((string *)local_d8);
        this_local = (DXCompilerImpl *)local_74;
      }
    }
    wstrProfile.field_2._8_8_ = this_local;
    GetHLSLProfileString_abi_cxx11_
              ((String *)local_110,(Diligent *)(ulong)(ShaderCI->Desc).ShaderType,
               (SHADER_TYPE)this_local,ShaderModel_00);
    __beg._M_current = (char *)std::__cxx11::string::begin();
    __end._M_current = (char *)std::__cxx11::string::end();
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::
    wstring<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              (local_138,__beg,__end,(allocator<wchar_t> *)((long)&wstrEntryPoint.field_2 + 0xf));
    std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&wstrEntryPoint.field_2 + 0xf))
    ;
    __s = ShaderCI->EntryPoint;
    sVar11 = strlen(__s);
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<char_const*,void>
              (local_170,__s,__s + sVar11,
               (allocator<wchar_t> *)
               ((long)&DxilArgs.
                       super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<wchar_t>::~allocator
              ((allocator<wchar_t> *)
               ((long)&DxilArgs.
                       super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    std::vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>::vector
              ((vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> *)local_190);
    DVar4 = DXCompilerLibrary::GetTarget(&this->m_Library);
    if (DVar4 == Direct3D12) {
      local_198 = L"-Zi";
      std::vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>::push_back
                ((vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> *)local_190,&local_198);
      local_1a0 = L"-Od";
      std::vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>::push_back
                ((vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> *)local_190,&local_1a0);
      local_1a8 = DXCompilerLibrary::GetVersion(&this->m_Library);
      Version::Version(&local_1b0,1,5);
      bVar3 = Version::operator>=(&local_1a8,&local_1b0);
      if (bVar3) {
        local_1b8 = L"-Qembed_debug";
        std::vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>::push_back
                  ((vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> *)local_190,&local_1b8
                  );
      }
    }
    else {
      DVar4 = DXCompilerLibrary::GetTarget(&this->m_Library);
      if (DVar4 == Vulkan) {
        local_1d8 = L"-Od";
        local_1e8 = L"-spirv";
        pwStack_1e0 = L"-fspv-reflect";
        local_1c8 = &local_1e8;
        local_1c0 = 3;
        __l._M_len = 3;
        __l._M_array = local_1c8;
        std::vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>::assign
                  ((vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> *)local_190,__l);
        local_351 = false;
        if (0x401fff < this->m_APIVersion) {
          Version::Version(&local_1f0,6,3);
          local_351 = Version::operator>=((Version *)&this_local,&local_1f0);
        }
        if (local_351 == false) {
          if (0x400fff < this->m_APIVersion) {
            msg_1.field_2._8_8_ = anon_var_dwarf_821787;
            std::vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>::push_back
                      ((vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> *)local_190,
                       (value_type *)((long)&msg_1.field_2 + 8));
          }
        }
        else {
          local_1f8 = L"-fspv-target-env=vulkan1.2";
          std::vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>::push_back
                    ((vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> *)local_190,
                     &local_1f8);
        }
      }
      else {
        FormatString<char[24]>((string *)local_220,(char (*) [24])"Unknown compiler target");
        pCVar9 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar9,"Compile",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompiler.cpp"
                   ,0x305);
        std::__cxx11::string::~string((string *)local_220);
      }
    }
    SVar5 = Diligent::operator&(ShaderCI->CompileFlags,SHADER_COMPILE_FLAG_PACK_MATRIX_ROW_MAJOR);
    if (SVar5 == SHADER_COMPILE_FLAG_NONE) {
      local_370.p = (IDxcBlob *)0xe6af00;
    }
    else {
      local_370.p = (IDxcBlob *)0xe6aeec;
    }
    pDXIL.super_CComPtrBase<IDxcBlob>.p = (CComPtrBase<IDxcBlob>)(CComPtrBase<IDxcBlob>)local_370.p;
    std::vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>::push_back
              ((vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> *)local_190,
               (value_type *)&pDXIL);
    CComPtr<IDxcBlob>::CComPtr(&pDxcLog);
    CComPtr<IDxcBlob>::CComPtr((CComPtr<IDxcBlob> *)&CA.ppCompilerOutput);
    IDXCompiler::CompileAttribs::CompileAttribs((CompileAttribs *)((long)&Source.field_2 + 8));
    local_378 = Preamble;
    if (Preamble == (char *)0x0) {
      local_378 = "";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_2b0,local_378,&local_2b1);
    std::allocator<char>::~allocator(&local_2b1);
    BuildHLSLSourceString_abi_cxx11_((String *)&Defines[0].Value,(Diligent *)ShaderCI,ShaderCI_00);
    std::__cxx11::string::append((string *)local_2b0);
    std::__cxx11::string::~string((string *)&Defines[0].Value);
    pwStack_2e8 = L"DXCOMPILER";
    Defines[0].Name = L"1";
    Source.field_2._8_8_ = std::__cxx11::string::c_str();
    CA.Source._0_4_ = std::__cxx11::string::length();
    CA._8_8_ = std::__cxx11::wstring::c_str();
    CA.EntryPoint = (wchar_t *)std::__cxx11::wstring::c_str();
    CA.Profile = (wchar_t *)&stack0xfffffffffffffd18;
    CA.pDefines._0_4_ = 1;
    CA._40_8_ = std::vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>::data
                          ((vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> *)local_190);
    sVar12 = std::vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>::size
                       ((vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> *)local_190);
    CA.pArgs._0_4_ = (undefined4)sVar12;
    CA._56_8_ = ShaderCI->pShaderSourceStreamFactory;
    CA.pShaderSourceStreamFactory =
         (IShaderSourceInputStreamFactory *)
         CComPtrBase<IDxcBlob>::operator&(&pDxcLog.super_CComPtrBase<IDxcBlob>);
    CA.ppBlobOut = CComPtrBase<IDxcBlob>::operator&((CComPtrBase<IDxcBlob> *)&CA.ppCompilerOutput);
    bVar3 = Compile(this,(CompileAttribs *)((long)&Source.field_2 + 8));
    HandleHLSLCompilerResult<IDxcBlob>
              (bVar3,(IDxcBlob *)CA.ppCompilerOutput,(string *)local_2b0,
               (ShaderCI->Desc).super_DeviceObjectAttribs.Name,ppCompilerOutput);
    if ((bVar3) &&
       (pIVar13 = CComPtrBase::operator_cast_to_IDxcBlob_((CComPtrBase *)&pDxcLog),
       pIVar13 != (IDxcBlob *)0x0)) {
      pIVar13 = CComPtrBase<IDxcBlob>::operator->(&pDxcLog.super_CComPtrBase<IDxcBlob>);
      iVar6 = (*(pIVar13->super_IUnknown)._vptr_IUnknown[4])();
      uVar10 = msg.field_2._8_8_;
      if (CONCAT44(extraout_var,iVar6) != 0) {
        if (msg.field_2._8_8_ != 0) {
          pIVar13 = CComPtrBase<IDxcBlob>::operator->(&pDxcLog.super_CComPtrBase<IDxcBlob>);
          iVar6 = (*(pIVar13->super_IUnknown)._vptr_IUnknown[3])();
          pIVar13 = CComPtrBase<IDxcBlob>::operator->(&pDxcLog.super_CComPtrBase<IDxcBlob>);
          iVar7 = (*(pIVar13->super_IUnknown)._vptr_IUnknown[3])();
          pIVar13 = CComPtrBase<IDxcBlob>::operator->(&pDxcLog.super_CComPtrBase<IDxcBlob>);
          iVar8 = (*(pIVar13->super_IUnknown)._vptr_IUnknown[4])();
          std::vector<unsigned_int,std::allocator<unsigned_int>>::assign<unsigned_int*,void>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)uVar10,
                     (uint *)CONCAT44(extraout_var_00,iVar6),
                     (uint *)(CONCAT44(extraout_var_01,iVar7) +
                             (CONCAT44(extraout_var_02,iVar8) & 0xfffffffffffffffc)));
        }
        if (ppByteCodeBlob != (IDxcBlob **)0x0) {
          pIVar13 = CComPtrBase<IDxcBlob>::Detach(&pDxcLog.super_CComPtrBase<IDxcBlob>);
          *ppByteCodeBlob = pIVar13;
        }
      }
    }
    std::__cxx11::string::~string((string *)local_2b0);
    CComPtr<IDxcBlob>::~CComPtr((CComPtr<IDxcBlob> *)&CA.ppCompilerOutput);
    CComPtr<IDxcBlob>::~CComPtr(&pDxcLog);
    std::vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>::~vector
              ((vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> *)local_190);
    std::__cxx11::wstring::~wstring(local_170);
    std::__cxx11::wstring::~wstring(local_138);
    std::__cxx11::string::~string((string *)local_110);
  }
  else {
    FormatString<char[26]>((string *)local_60,(char (*) [26])"DX compiler is not loaded");
    pCVar9 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar9,"Compile",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompiler.cpp"
               ,0x2ba);
    std::__cxx11::string::~string((string *)local_60);
  }
  return;
}

Assistant:

void DXCompilerImpl::Compile(const ShaderCreateInfo& ShaderCI,
                             ShaderVersion           ShaderModel,
                             const char*             Preamble,
                             IDxcBlob**              ppByteCodeBlob,
                             std::vector<uint32_t>*  pByteCode,
                             IDataBlob**             ppCompilerOutput) noexcept(false)
{
    if (!IsLoaded())
    {
        UNEXPECTED("DX compiler is not loaded");
        return;
    }

    ShaderVersion MaxSM = GetMaxShaderModel();

    // validate shader version
    if (ShaderModel == ShaderVersion{})
    {
        ShaderModel = MaxSM;
    }
    else if (ShaderModel.Major < 6)
    {
        LOG_INFO_MESSAGE("DXC only supports shader model 6.0+. Upgrading the specified shader model ",
                         Uint32{ShaderModel.Major}, '_', Uint32{ShaderModel.Minor}, " to 6_0");
        ShaderModel = ShaderVersion{6, 0};
    }
    else if (ShaderModel > MaxSM)
    {
        LOG_WARNING_MESSAGE("The maximum supported shader model by DXC is ", Uint32{MaxSM.Major}, '_', Uint32{MaxSM.Minor},
                            ". The specified shader model ", Uint32{ShaderModel.Major}, '_', Uint32{ShaderModel.Minor}, " will be downgraded.");
        ShaderModel = MaxSM;
    }

    const String       Profile = GetHLSLProfileString(ShaderCI.Desc.ShaderType, ShaderModel);
    const std::wstring wstrProfile{Profile.begin(), Profile.end()};
    const std::wstring wstrEntryPoint{ShaderCI.EntryPoint, ShaderCI.EntryPoint + strlen(ShaderCI.EntryPoint)};

    std::vector<const wchar_t*> DxilArgs;
    if (m_Library.GetTarget() == DXCompilerTarget::Direct3D12)
    {
        //DxilArgs.push_back(L"-WX");  // Warnings as errors
#ifdef DILIGENT_DEBUG
        DxilArgs.push_back(DXC_ARG_DEBUG);              // Debug info
        DxilArgs.push_back(DXC_ARG_SKIP_OPTIMIZATIONS); // Disable optimization
        if (m_Library.GetVersion() >= Version{1, 5})
        {
            // Silence the following warning:
            // no output provided for debug - embedding PDB in shader container.  Use -Qembed_debug to silence this warning.
            DxilArgs.push_back(L"-Qembed_debug");
        }
#else
        if (m_Library.GetVersion() >= Version{1, 5})
            DxilArgs.push_back(DXC_ARG_OPTIMIZATION_LEVEL3); // Optimization level 3
        else
            DxilArgs.push_back(DXC_ARG_SKIP_OPTIMIZATIONS); // TODO: something goes wrong if optimization is enabled
#endif
    }
    else if (m_Library.GetTarget() == DXCompilerTarget::Vulkan)
    {
        DxilArgs.assign(
            {
                L"-spirv",
                L"-fspv-reflect",
#ifdef DILIGENT_DEBUG
                DXC_ARG_SKIP_OPTIMIZATIONS,
#else
                DXC_ARG_OPTIMIZATION_LEVEL3
#endif
            });

        if (m_APIVersion >= VK_API_VERSION_1_2 && ShaderModel >= ShaderVersion{6, 3})
        {
            // Ray tracing requires SM 6.3 and Vulkan 1.2
            // Inline ray tracing requires SM 6.5 and Vulkan 1.2
            DxilArgs.push_back(L"-fspv-target-env=vulkan1.2");
        }
        else if (m_APIVersion >= VK_API_VERSION_1_1)
        {
            // Wave operations require SM 6.0 and Vulkan 1.1
            DxilArgs.push_back(L"-fspv-target-env=vulkan1.1");
        }
    }
    else
    {
        UNEXPECTED("Unknown compiler target");
    }
    DxilArgs.push_back((ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_PACK_MATRIX_ROW_MAJOR) != 0 ?
                           DXC_ARG_PACK_MATRIX_ROW_MAJOR :
                           DXC_ARG_PACK_MATRIX_COLUMN_MAJOR);

    CComPtr<IDxcBlob> pDXIL;
    CComPtr<IDxcBlob> pDxcLog;

    IDXCompiler::CompileAttribs CA;

    String Source{Preamble != nullptr ? Preamble : ""};
    Source.append(BuildHLSLSourceString(ShaderCI));

    DxcDefine Defines[] = {{L"DXCOMPILER", L"1"}};

    CA.Source                     = Source.c_str();
    CA.SourceLength               = static_cast<Uint32>(Source.length());
    CA.EntryPoint                 = wstrEntryPoint.c_str();
    CA.Profile                    = wstrProfile.c_str();
    CA.pDefines                   = Defines;
    CA.DefinesCount               = _countof(Defines);
    CA.pArgs                      = DxilArgs.data();
    CA.ArgsCount                  = static_cast<Uint32>(DxilArgs.size());
    CA.pShaderSourceStreamFactory = ShaderCI.pShaderSourceStreamFactory;
    CA.ppBlobOut                  = &pDXIL;
    CA.ppCompilerOutput           = &pDxcLog;

    bool result = Compile(CA);
    HandleHLSLCompilerResult(result, pDxcLog.p, Source, ShaderCI.Desc.Name, ppCompilerOutput);

    if (result && pDXIL && pDXIL->GetBufferSize() > 0)
    {
        if (pByteCode != nullptr)
            pByteCode->assign(static_cast<uint32_t*>(pDXIL->GetBufferPointer()),
                              static_cast<uint32_t*>(pDXIL->GetBufferPointer()) + pDXIL->GetBufferSize() / sizeof(uint32_t));

        if (ppByteCodeBlob != nullptr)
            *ppByteCodeBlob = pDXIL.Detach();
    }
}